

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scheduler.cpp
# Opt level: O0

void Repeat(CScheduler *s,Function *f,milliseconds delta)

{
  long lVar1;
  CScheduler *in_RSI;
  anon_class_48_3_18afc5c3 *in_RDI;
  long in_FS_OFFSET;
  anon_class_48_3_18afc5c3 *in_stack_ffffffffffffff58;
  function<void_()> *in_stack_ffffffffffffff78;
  Function *in_stack_ffffffffffffff80;
  milliseconds in_stack_ffffffffffffffb8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  wallet::_GLOBAL__N_1::std::function<void_()>::operator()
            ((function<void_()> *)in_stack_ffffffffffffff58);
  wallet::_GLOBAL__N_1::std::function<void_()>::function
            ((function<void_()> *)in_stack_ffffffffffffff78,(function<void_()> *)in_RDI);
  std::function<void()>::
  function<Repeat(CScheduler&,std::function<void()>,std::chrono::duration<long,std::ratio<1l,1000l>>)::__0,void>
            (in_stack_ffffffffffffff78,in_RDI);
  CScheduler::scheduleFromNow(in_RSI,in_stack_ffffffffffffff80,in_stack_ffffffffffffffb8);
  std::function<void_()>::~function((function<void_()> *)in_stack_ffffffffffffff58);
  Repeat(CScheduler&,std::function<void()>,std::chrono::duration<long,std::ratio<1l,1000l>>)::$_0::
  ~__0(in_stack_ffffffffffffff58);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void Repeat(CScheduler& s, CScheduler::Function f, std::chrono::milliseconds delta)
{
    f();
    s.scheduleFromNow([=, &s] { Repeat(s, f, delta); }, delta);
}